

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool units::isolatePriorModifier(string *unit_string,string *modifier,char check1,char check2)

{
  char cVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  size_type sVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool local_38;
  
  local_38 = false;
  sVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unit_string,(modifier->_M_dataplus)._M_p,0,modifier->_M_string_length);
  if (sVar5 != 0xffffffffffffffff) {
    uVar6 = (ulong)((modifier->_M_dataplus)._M_p[modifier->_M_string_length - 1] != ' ') +
            modifier->_M_string_length + sVar5;
    uVar9 = 0xffffffffffffffff;
    if (uVar6 < unit_string->_M_string_length) {
      do {
        uVar9 = uVar6;
        if ((unit_string->_M_dataplus)._M_p[uVar6] != ' ') break;
        uVar6 = uVar6 + 1;
        uVar9 = 0xffffffffffffffff;
      } while (unit_string->_M_string_length != uVar6);
    }
    if ((uVar9 == 0xffffffffffffffff) ||
       (pcVar2 = (unit_string->_M_dataplus)._M_p, cVar1 = pcVar2[uVar9],
       cVar1 != check1 && cVar1 != check2)) {
      local_38 = false;
    }
    else {
      pcVar2[uVar9 - 1] = '_';
      local_38 = true;
    }
    uVar6 = unit_string->_M_string_length;
    uVar10 = 0xffffffffffffffff;
    if (uVar9 <= uVar6 && uVar6 - uVar9 != 0) {
      pcVar2 = (unit_string->_M_dataplus)._M_p;
      pvVar7 = memchr(pcVar2 + uVar9,0x20,uVar6 - uVar9);
      uVar10 = -(ulong)(pvVar7 == (void *)0x0) | (long)pvVar7 - (long)pcVar2;
    }
    bVar12 = uVar6 <= uVar10;
    if (!bVar12) {
      pcVar2 = (unit_string->_M_dataplus)._M_p;
      cVar1 = pcVar2[uVar10 + 1];
      bVar12 = true;
      if ((cVar1 != '*') && (cVar1 != '/')) {
        cVar1 = pcVar2[uVar10 - 1];
        bVar12 = cVar1 == '/' || cVar1 == '*';
      }
    }
    if (!bVar12) {
      pcVar2 = (unit_string->_M_dataplus)._M_p;
      bVar12 = true;
      if (pcVar2[uVar10 + 1] != '(') {
        bVar12 = pcVar2[uVar10 - 1] == '(';
      }
      bVar14 = true;
      bVar13 = true;
      if (pcVar2[uVar10 + 1] != '-' && !bVar12) {
        bVar13 = pcVar2[uVar10 - 1] == '-';
      }
      if (!(bool)(bVar12 | bVar13)) {
        iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          unit_string,uVar10 + 1,2,"of");
        bVar14 = iVar4 == 0;
      }
      bVar14 = (bool)(bVar14 | bVar12 | bVar13);
      bVar12 = true;
      if (!bVar14) {
        bVar12 = (unit_string->_M_dataplus)._M_p[uVar10 + 1] == 'U';
      }
      bVar12 = (bool)(bVar12 | bVar14);
    }
    if (!bVar12) {
      uVar9 = unit_string->_M_string_length;
      uVar11 = 0xffffffffffffffff;
      uVar6 = 0xffffffffffffffff;
      if (uVar9 != 0) {
        uVar8 = sVar5 + 1;
        if (uVar9 - 1 <= sVar5) {
          uVar8 = uVar9;
        }
        do {
          uVar6 = uVar8 - 1;
          if (uVar8 == 0) {
            uVar6 = 0xffffffffffffffff;
            break;
          }
          lVar3 = uVar8 - 1;
          uVar8 = uVar6;
        } while ((unit_string->_M_dataplus)._M_p[lVar3] != '/');
      }
      uVar8 = sVar5 + 1;
      if (uVar8 <= uVar9 && uVar9 - uVar8 != 0) {
        pcVar2 = (unit_string->_M_dataplus)._M_p;
        pvVar7 = memchr(pcVar2 + uVar8,0x2f,uVar9 - uVar8);
        uVar11 = -(ulong)(pvVar7 == (void *)0x0) | (long)pvVar7 - (long)pcVar2;
      }
      if (uVar6 < sVar5) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                   uVar6 + 1,1,'(');
        uVar10 = uVar10 + 1;
        if (uVar11 == 0xffffffffffffffff) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string
                    ,')');
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
                 uVar11 + 1,1,')');
        }
        bVar12 = uVar11 < uVar10;
        local_38 = true;
      }
      else {
        bVar12 = uVar11 < uVar10;
      }
    }
    if (!bVar12) {
      (unit_string->_M_dataplus)._M_p[uVar10] = '*';
      local_38 = true;
    }
  }
  return local_38;
}

Assistant:

static bool isolatePriorModifier(
    std::string& unit_string,
    const std::string& modifier,
    char check1,
    char check2)
{
    bool modified{false};
    auto modfind = unit_string.find(modifier);
    if (modfind != std::string::npos) {
        auto offset = modfind + modifier.size();
        // LCOV_EXCL_START
        // this condition is not used in current use cases but it is dangerous
        // to make assumptions that will always be the case
        if (modifier.back() != ' ') {
            ++offset;
        }
        // LCOV_EXCL_STOP
        auto kloc = unit_string.find_first_not_of(' ', offset);
        if (kloc != std::string::npos &&
            (unit_string[kloc] == check1 || unit_string[kloc] == check2)) {
            // this handles a misinterpretation of square+d to squared when in
            // middle of a unit
            unit_string[kloc - 1] = '_';
            modified = true;
        }
        auto nspace = unit_string.find_first_of(' ', kloc);
        auto skip = (nspace >= unit_string.size());
        if (!skip) {
            skip = isOperator(unit_string[nspace + 1]) ||
                isOperator(unit_string[nspace - 1]);
        }
        if (!skip) {
            skip = unit_string[nspace + 1] == '(' ||
                unit_string[nspace - 1] == '(';
            skip |=
                (skip || unit_string[nspace + 1] == '-' ||
                 unit_string[nspace - 1] == '-');
            skip |= skip || (unit_string.compare(nspace + 1, 2, "of") == 0);
            skip |= skip ||
                unit_string[nspace + 1] ==
                    'U';  // handle distance units with UK or US modifier
        }
        if (!skip) {
            auto divloc = unit_string.find_last_of('/', modfind);
            auto divloc2 = unit_string.find_first_of('/', modfind + 1);
            if (divloc < modfind) {
                unit_string.insert(divloc + 1, 1, '(');
                ++nspace;
                if (divloc2 != std::string::npos) {
                    unit_string.insert(divloc2 + 1, 1, ')');
                    // don't worry about nspace increment here as it will be
                    // skipped or the insertion after the space
                } else {
                    unit_string.push_back(')');
                }

                skip |= (divloc2 < nspace);
                modified = true;
            } else if (divloc2 < nspace) {
                skip = true;
            }
        }
        if (!skip) {
            unit_string[nspace] = '*';
            modified = true;
        }
    }
    return modified;
}